

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O2

bool __thiscall
glslang::TSymbolTableLevel::insertAnonymousMembers
          (TSymbolTableLevel *this,TSymbol *symbol,int firstMember)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 extraout_var;
  TType *this_00;
  TTypeList *pTVar4;
  undefined8 *puVar5;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__str;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_EDX;
  uint extraout_EDX_00;
  undefined4 extraout_var_03;
  uint m;
  TSymbol *this_01;
  ulong uVar6;
  ulong uVar7;
  undefined1 local_60 [48];
  undefined4 extraout_var_00;
  
  this_01 = symbol;
  iVar1 = (*symbol->_vptr_TSymbol[9])(symbol);
  this_00 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x60))
                               ((long *)CONCAT44(extraout_var,iVar1));
  pTVar4 = TType::getStruct(this_00);
  do {
    uVar6 = (ulong)(uint)firstMember;
    uVar7 = (long)(pTVar4->
                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pTVar4->
                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (uVar7 <= uVar6) break;
    puVar5 = (undefined8 *)TSymbol::operator_new((TSymbol *)0x40,(size_t)this_01);
    iVar1 = (*((pTVar4->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
               ).super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar6].type)->_vptr_TType[6])();
    __str = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
            CONCAT44(extraout_var_00,iVar1);
    iVar1 = (*symbol->_vptr_TSymbol[9])(symbol);
    iVar2 = (*symbol->_vptr_TSymbol[9])(symbol);
    uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0xe8))
                      ((long *)CONCAT44(extraout_var_02,iVar2));
    puVar5[1] = __str;
    puVar5[2] = __str;
    puVar5[3] = 0;
    puVar5[4] = 0;
    *(undefined1 *)(puVar5 + 5) = 1;
    *puVar5 = &PTR_clone_0089aa20;
    puVar5[6] = CONCAT44(extraout_var_01,iVar1);
    *(int *)(puVar5 + 7) = firstMember;
    *(undefined4 *)((long)puVar5 + 0x3c) = uVar3;
    this_01 = (TSymbol *)local_60;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 this_01,__str);
    local_60._40_8_ = puVar5;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>,std::_Select1st<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>>>
    ::
    _M_emplace_unique<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>const>
              ((pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>,_bool>
                *)this,(_Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>,std::_Select1st<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const,glslang::TSymbol*>>>
                        *)this_01,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>
                *)CONCAT44(extraout_var_03,extraout_EDX));
    firstMember = firstMember + 1;
  } while ((extraout_EDX_00 & 1) != 0);
  return uVar7 <= uVar6;
}

Assistant:

bool insertAnonymousMembers(TSymbol& symbol, int firstMember)
    {
        const TTypeList& types = *symbol.getAsVariable()->getType().getStruct();
        for (unsigned int m = firstMember; m < types.size(); ++m) {
            TAnonMember* member = new TAnonMember(&types[m].type->getFieldName(), m, *symbol.getAsVariable(), symbol.getAsVariable()->getAnonId());
            if (! level.insert(tLevelPair(member->getMangledName(), member)).second)
                return false;
        }

        return true;
    }